

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::LegacyScriptPubKeyMan::ImportScripts
          (LegacyScriptPubKeyMan *this,
          set<CScript,_std::less<CScript>,_std::allocator<CScript>_> scripts,int64_t timestamp)

{
  FillableSigningProvider *pFVar1;
  _Rb_tree_node_base *in;
  uint uVar2;
  _Rb_tree_node_base *p_Var3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  mapped_type *pmVar7;
  _Rb_tree_node_base *p_Var8;
  uint uVar9;
  long in_RDX;
  long args_1;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  CScriptID id;
  WalletBatch local_80;
  string local_70;
  CScriptID local_4c;
  long local_38;
  WalletDatabase *pWVar6;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar6 = (WalletDatabase *)CONCAT44(extraout_var,iVar5);
  (*pWVar6->_vptr_WalletDatabase[0xe])(&local_80,pWVar6,1);
  p_Var8 = *(_Rb_tree_node_base **)(timestamp + 0x18);
  local_80.m_database = pWVar6;
  if (p_Var8 != (_Rb_tree_node_base *)(timestamp + 8)) {
    pFVar1 = &(this->super_LegacyDataSPKM).super_FillableSigningProvider;
    do {
      in = p_Var8 + 1;
      CScriptID::CScriptID(&local_4c,(CScript *)in);
      iVar5 = (*(pFVar1->super_SigningProvider)._vptr_SigningProvider[3])(pFVar1,&local_4c);
      if ((char)iVar5 == '\0') {
        bVar4 = AddCScriptWithDB(this,&local_80,(CScript *)in);
        if (!bVar4) {
          bVar4 = false;
          goto LAB_00bd8aae;
        }
        if (0 < in_RDX) {
          CScriptID::CScriptID((CScriptID *)&local_70,(CScript *)in);
          pmVar7 = std::
                   map<CScriptID,_wallet::CKeyMetadata,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>_>
                   ::operator[](&(this->super_LegacyDataSPKM).m_script_metadata,
                                (key_type *)&local_70);
          pmVar7->nCreateTime = in_RDX;
        }
      }
      else {
        uVar2 = *(uint *)((long)&p_Var8[1]._M_right + 4);
        uVar9 = uVar2 - 0x1d;
        p_Var3 = *(_Rb_tree_node_base **)(p_Var8 + 1);
        if (uVar2 < 0x1d) {
          uVar9 = uVar2;
          p_Var3 = in;
        }
        s.m_size._0_4_ = uVar9;
        s.m_data = (uchar *)p_Var3;
        s.m_size._4_4_ = 0;
        HexStr_abi_cxx11_(&local_70,s);
        ScriptPubKeyMan::WalletLogPrintf<std::__cxx11::string>
                  ((ScriptPubKeyMan *)this,(ConstevalFormatString<1U>)0x10e1f71,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != (_Rb_tree_node_base *)(timestamp + 8));
  }
  bVar4 = true;
  if (0 < in_RDX) {
    if ((in_RDX == 1) ||
       (args_1 = this->nTimeFirstKey, args_1 == 0x7fffffffffffffff || in_RDX < args_1)) {
      this->nTimeFirstKey = in_RDX;
      args_1 = in_RDX;
    }
    boost::signals2::
    signal<void_(const_wallet::ScriptPubKeyMan_*,_long),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_wallet::ScriptPubKeyMan_*,_long)>,_boost::function<void_(const_boost::signals2::connection_&,_const_wallet::ScriptPubKeyMan_*,_long)>,_boost::signals2::mutex>
    ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.NotifyFirstKeyTimeChanged,
                 (ScriptPubKeyMan *)this,args_1);
  }
LAB_00bd8aae:
  if (local_80.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (**(code **)(*(long *)local_80.m_batch._M_t.
                          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl + 0x28
                ))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::ImportScripts(const std::set<CScript> scripts, int64_t timestamp)
{
    WalletBatch batch(m_storage.GetDatabase());
    for (const auto& entry : scripts) {
        CScriptID id(entry);
        if (HaveCScript(id)) {
            WalletLogPrintf("Already have script %s, skipping\n", HexStr(entry));
            continue;
        }
        if (!AddCScriptWithDB(batch, entry)) {
            return false;
        }

        if (timestamp > 0) {
            m_script_metadata[CScriptID(entry)].nCreateTime = timestamp;
        }
    }
    if (timestamp > 0) {
        UpdateTimeFirstKey(timestamp);
    }

    return true;
}